

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMXPathExpressionImpl.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DOMXPathExpressionImpl::testNode
          (DOMXPathExpressionImpl *this,XPathMatcher *matcher,DOMXPathResultImpl *result,
          DOMElement *node)

{
  XMLStringPool *pXVar1;
  byte bVar2;
  uchar uVar3;
  bool bVar4;
  int iVar5;
  uint uriId_00;
  uint uriId_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  long *plVar7;
  XMLAttr *this_00;
  undefined8 uVar8;
  XMLCh *rawName;
  XMLCh *attrValue;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMElement *local_170;
  DOMNode *child;
  uchar nMatch;
  DOMAttr *attr;
  XMLSize_t i;
  RefVectorOf<xercesc_4_0::XMLAttr> attrList;
  XMLSize_t attrCount;
  DOMNamedNodeMap *attrMap;
  undefined1 local_100 [8];
  SchemaElementDecl elemDecl;
  QName qName;
  int uriId;
  DOMElement *node_local;
  DOMXPathResultImpl *result_local;
  XPathMatcher *matcher_local;
  DOMXPathExpressionImpl *this_local;
  undefined4 extraout_var_01;
  
  pXVar1 = this->fStringPool;
  iVar5 = (*(node->super_DOMNode)._vptr_DOMNode[0x16])();
  uriId_00 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])
                       (pXVar1,CONCAT44(extraout_var,iVar5));
  iVar5 = (*(node->super_DOMNode)._vptr_DOMNode[2])();
  QName::QName((QName *)&elemDecl.fDatatypeValidator,(XMLCh *)CONCAT44(extraout_var_00,iVar5),
               uriId_00,this->fMemoryManager);
  SchemaElementDecl::SchemaElementDecl
            ((SchemaElementDecl *)local_100,(QName *)&elemDecl.fDatatypeValidator,Any,0xfffffffe,
             XMLPlatformUtils::fgMemoryManager);
  iVar5 = (*(node->super_DOMNode)._vptr_DOMNode[0xb])();
  plVar6 = (long *)CONCAT44(extraout_var_01,iVar5);
  attrList.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager =
       (MemoryManager *)(**(code **)(*plVar6 + 0x28))();
  RefVectorOf<xercesc_4_0::XMLAttr>::RefVectorOf
            ((RefVectorOf<xercesc_4_0::XMLAttr> *)&i,
             (XMLSize_t)attrList.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager,true,
             this->fMemoryManager);
  for (attr = (DOMAttr *)0x0;
      attr < attrList.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager;
      attr = (DOMAttr *)((long)&(attr->super_DOMNode)._vptr_DOMNode + 1)) {
    plVar7 = (long *)(**(code **)(*plVar6 + 0x18))(plVar6,attr);
    this_00 = (XMLAttr *)XMemory::operator_new(0x28,this->fMemoryManager);
    pXVar1 = this->fStringPool;
    uVar8 = (**(code **)(*plVar7 + 0xb0))();
    uriId_01 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,uVar8);
    rawName = (XMLCh *)(**(code **)(*plVar7 + 0x10))();
    attrValue = (XMLCh *)(**(code **)(*plVar7 + 0x18))();
    bVar2 = (**(code **)(*plVar7 + 0x148))();
    XMLAttr::XMLAttr(this_00,uriId_01,rawName,attrValue,AttTypes_Min,(bool)(bVar2 & 1),
                     this->fMemoryManager,(DatatypeValidator *)0x0,true);
    BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
              ((BaseRefVectorOf<xercesc_4_0::XMLAttr> *)&i,this_00);
  }
  iVar5 = (*(node->super_DOMNode)._vptr_DOMNode[0x17])();
  (*matcher->_vptr_XPathMatcher[4])
            (matcher,local_100,(ulong)uriId_00,CONCAT44(extraout_var_02,iVar5),&i,
             attrList.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager,0);
  uVar3 = XPathMatcher::isMatched(matcher);
  if ((uVar3 != '\0') && (uVar3 != '\r')) {
    DOMXPathResultImpl::addResult(result,&node->super_DOMNode);
    iVar5 = (*(result->super_DOMXPathResult)._vptr_DOMXPathResult[2])();
    if ((iVar5 == 8) ||
       (iVar5 = (*(result->super_DOMXPathResult)._vptr_DOMXPathResult[2])(), iVar5 == 9)) {
      this_local._7_1_ = true;
      goto LAB_0031f6ee;
    }
  }
  if (((uVar3 == '\0') || (uVar3 == '\x05')) || (uVar3 == '\r')) {
    iVar5 = (*(node->super_DOMNode)._vptr_DOMNode[7])();
    local_170 = (DOMElement *)CONCAT44(extraout_var_03,iVar5);
    while (local_170 != (DOMElement *)0x0) {
      iVar5 = (*(local_170->super_DOMNode)._vptr_DOMNode[4])();
      if ((iVar5 == 1) && (bVar4 = testNode(this,matcher,result,local_170), bVar4)) {
        this_local._7_1_ = true;
        goto LAB_0031f6ee;
      }
      iVar5 = (*(local_170->super_DOMNode)._vptr_DOMNode[10])();
      local_170 = (DOMElement *)CONCAT44(extraout_var_04,iVar5);
    }
  }
  (*matcher->_vptr_XPathMatcher[5])(matcher,local_100,&XMLUni::fgZeroLenString,0);
  this_local._7_1_ = false;
LAB_0031f6ee:
  RefVectorOf<xercesc_4_0::XMLAttr>::~RefVectorOf((RefVectorOf<xercesc_4_0::XMLAttr> *)&i);
  SchemaElementDecl::~SchemaElementDecl((SchemaElementDecl *)local_100);
  QName::~QName((QName *)&elemDecl.fDatatypeValidator);
  return this_local._7_1_;
}

Assistant:

bool DOMXPathExpressionImpl::testNode(XPathMatcher* matcher, DOMXPathResultImpl* result, DOMElement *node) const
{
    int uriId=fStringPool->addOrFind(node->getNamespaceURI());
    QName qName(node->getNodeName(), uriId, fMemoryManager);
    SchemaElementDecl elemDecl(&qName);
    DOMNamedNodeMap* attrMap=node->getAttributes();
    XMLSize_t attrCount = attrMap->getLength();
    RefVectorOf<XMLAttr> attrList(attrCount, true, fMemoryManager);
    for(XMLSize_t i=0;i<attrCount;i++)
    {
        DOMAttr* attr=(DOMAttr*)attrMap->item(i);
        attrList.addElement(new (fMemoryManager) XMLAttr(fStringPool->addOrFind(attr->getNamespaceURI()),
                                                         attr->getNodeName(),
                                                         attr->getNodeValue(),
                                                         XMLAttDef::CData,
                                                         attr->getSpecified(),
                                                         fMemoryManager,
                                                         NULL,
                                                         true));
    }
    matcher->startElement(elemDecl, uriId, node->getPrefix(), attrList, attrCount);
    unsigned char nMatch=matcher->isMatched();
    if(nMatch!=0 && nMatch!=XPathMatcher::XP_MATCHED_DP)
    {
        result->addResult(node);
        if(result->getResultType()==DOMXPathResult::ANY_UNORDERED_NODE_TYPE || result->getResultType()==DOMXPathResult::FIRST_ORDERED_NODE_TYPE)
            return true;    // abort navigation, we found one result
    }

    if(nMatch==0 || nMatch==XPathMatcher::XP_MATCHED_D || nMatch==XPathMatcher::XP_MATCHED_DP)
    {
        DOMNode* child=node->getFirstChild();
        while(child)
        {
            if(child->getNodeType()==DOMNode::ELEMENT_NODE)
                if(testNode(matcher, result, (DOMElement*)child))
                    return true;
            child=child->getNextSibling();
        }
    }
    matcher->endElement(elemDecl, XMLUni::fgZeroLenString);
    return false;
}